

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O1

EmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EmitMemAccess<false,false>
          (WasmBytecodeGenerator *this,WasmOp wasmOp,WasmType *signature,ViewType viewType)

{
  WasmType type;
  uint uVar1;
  WasmBinaryReader *pWVar2;
  WasmRegisterSpace *this_00;
  EmitInfo EVar3;
  WasmCompilationException *this_01;
  undefined7 in_register_00000009;
  WasmBinaryReader *pWVar4;
  EmitInfo local_40;
  EmitInfo exprInfo;
  
  type = *signature;
  SetUsesMemory(this,0);
  exprInfo.type = (WasmType)CONCAT71(in_register_00000009,viewType);
  pWVar2 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  pWVar4 = pWVar2;
  if (pWVar2 == (WasmBinaryReader *)0x0) {
    pWVar4 = (this->m_module->m_reader).ptr;
  }
  if (pWVar2 == (WasmBinaryReader *)0x0) {
    pWVar2 = (this->m_module->m_reader).ptr;
  }
  if ((uint)(pWVar4->super_WasmReaderBase).m_currentNode.field_1.mem.alignment <=
      *(uint *)(Js::ArrayBufferView::NaturalAlignment +
               (CONCAT71(in_register_00000009,viewType) & 0xffffffff) * 4)) {
    uVar1 = (pWVar2->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
    local_40 = PopEvalStack(this,FirstLocalType,L"Index expression must be of type i32");
    ReleaseLocation(this,&local_40);
    this_00 = GetRegisterSpace(this,type);
    EVar3.super_EmitInfoBase.location = WAsmJs::RegisterSpace::AcquireTmpRegister(this_00);
    (*this->m_writer->_vptr_IWasmByteCodeWriter[0x1c])
              (this->m_writer,0x5a,(ulong)EVar3.super_EmitInfoBase.location,
               (ulong)local_40 & 0xffffffff,(ulong)uVar1,(ulong)(byte)(undefined1)exprInfo.type);
    EVar3.type = type;
    return EVar3;
  }
  this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
  WasmCompilationException::WasmCompilationException
            (this_01,L"alignment must not be larger than natural");
  __cxa_throw(this_01,&WasmCompilationException::typeinfo,
              WasmCompilationException::~WasmCompilationException);
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitMemAccess(WasmOp wasmOp, const WasmTypes::WasmType* signature, Js::ArrayBufferView::ViewType viewType)
{
    Assert(!isAtomic || Wasm::Threads::IsEnabled());
    WasmTypes::WasmType type = signature[0];
    SetUsesMemory(0);

    const uint32 naturalAlignment = Js::ArrayBufferView::NaturalAlignment[viewType];
    const uint32 alignment = GetReader()->m_currentNode.mem.alignment;
    const uint32 offset = GetReader()->m_currentNode.mem.offset;

    if (alignment > naturalAlignment)
    {
        throw WasmCompilationException(_u("alignment must not be larger than natural"));
    }
    if (isAtomic && alignment != naturalAlignment)
    {
        throw WasmCompilationException(_u("invalid alignment for atomic RW. Expected %u, got %u"), naturalAlignment, alignment);
    }

    // Stores
    if (isStore)
    {
        EmitInfo rhsInfo = PopEvalStack(type, _u("Invalid type for store op"));
        EmitInfo exprInfo = PopEvalStack(WasmTypes::I32, _u("Index expression must be of type i32"));
        Js::OpCodeAsmJs op = isAtomic ? Js::OpCodeAsmJs::StArrAtomic : Js::OpCodeAsmJs::StArrWasm;
        m_writer->WasmMemAccess(op, rhsInfo.location, exprInfo.location, offset, viewType);
        ReleaseLocation(&rhsInfo);
        ReleaseLocation(&exprInfo);

        return EmitInfo();
    }

    // Loads
    EmitInfo exprInfo = PopEvalStack(WasmTypes::I32, _u("Index expression must be of type i32"));
    ReleaseLocation(&exprInfo);
    Js::RegSlot resultReg = GetRegisterSpace(type)->AcquireTmpRegister();
    Js::OpCodeAsmJs op = isAtomic ? Js::OpCodeAsmJs::LdArrAtomic : Js::OpCodeAsmJs::LdArrWasm;
    m_writer->WasmMemAccess(op, resultReg, exprInfo.location, offset, viewType);

    return EmitInfo(resultReg, type);
}